

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void dg::llvmdg::LLVMSlicer::adjustPhiNodes(BasicBlock *pred,BasicBlock *blk)

{
  bool bVar1;
  ret_type this;
  int idx;
  PHINode *phi;
  Instruction *I;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  BasicBlock *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_20 [4];
  
  local_20[0].NodePtr = (node_pointer)llvm::BasicBlock::begin(in_stack_ffffffffffffffb8);
  local_28.NodePtr = (node_pointer)llvm::BasicBlock::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = llvm::operator!=(local_20,&local_28);
    if (!bVar1) {
      return;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                 *)0x1bb075);
    this = llvm::dyn_cast<llvm::PHINode,llvm::Instruction>
                     ((Instruction *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (this == (ret_type)0x0) break;
    in_stack_ffffffffffffffc4 =
         llvm::PHINode::getBasicBlockIndex
                   (this,(BasicBlock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                   );
    if (-1 < in_stack_ffffffffffffffc4) {
      llvm::PHINode::removeIncomingValue((uint)this,SUB41(in_stack_ffffffffffffffc4,0));
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void adjustPhiNodes(llvm::BasicBlock *pred, llvm::BasicBlock *blk) {
        using namespace llvm;

        for (Instruction &I : *pred) {
            PHINode *phi = dyn_cast<PHINode>(&I);
            if (phi) {
                // don't try remove block that we already removed
                int idx = phi->getBasicBlockIndex(blk);
                if (idx < 0)
                    continue;

                // the second argument is DeletePHIIFEmpty.
                // We don't want that, since that would make
                // dependence graph inconsistent. We'll
                // slice it away later, if it's empty
                phi->removeIncomingValue(idx, false);
            } else {
                // phi nodes are always at the beginning of the block
                // so if this is the first value that is not PHI,
                // there won't be any other and we can bail out
                break;
            }
        }
    }